

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O1

void __thiscall server::ctfservmode::setupholdspawns(ctfservmode *this)

{
  flag *pfVar1;
  bool bVar2;
  int i;
  int i_00;
  anon_union_12_3_07544735_for_vec_0 local_3c;
  
  if ((((gamemode + 3U < 0x1a) && ((0x4c0000UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) &&
      ((this->holdspawns).ulen != 0)) && (i_00 = (this->flags).ulen, i_00 < 1)) {
    do {
      local_3c._0_8_ = 0;
      local_3c.field_0.z = 0.0;
      bVar2 = addflag(this,i_00,(vec *)&local_3c.field_0,0,0);
      if (!bVar2) {
        return;
      }
      pfVar1 = (this->flags).buf;
      spawnflag(this,i_00);
      pfVar1[i_00].version = pfVar1[i_00].version + 1;
      sendf(-1,1,"ri6");
      i_00 = (this->flags).ulen;
    } while (i_00 < 1);
  }
  return;
}

Assistant:

void setupholdspawns()
    {
        if(!m_hold || holdspawns.empty()) return;
        while(flags.length() < HOLDFLAGS)
        {
            int i = flags.length();
            if(!addflag(i, vec(0, 0, 0), 0, 0)) break;
            flag &f = flags[i];
            spawnflag(i);
            sendf(-1, 1, "ri6", N_RESETFLAG, i, ++f.version, f.spawnindex, 0, 0);
        }
    }